

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_log.cpp
# Opt level: O0

void __thiscall cubeb_async_logger::push(cubeb_async_logger *this,char *str)

{
  cubeb_log_message *in_RDI;
  cubeb_log_message msg;
  ring_buffer_base<cubeb_log_message> *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  cubeb_log_message *in_stack_ffffffffffffff00;
  
  cubeb_log_message::cubeb_log_message(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  ring_buffer_base<cubeb_log_message>::enqueue(in_stack_fffffffffffffef0,in_RDI);
  return;
}

Assistant:

void push(char const str[CUBEB_LOG_MESSAGE_MAX_SIZE])
  {
    cubeb_log_message msg(str);
    msg_queue.enqueue(msg);
  }